

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo_p.h
# Opt level: O1

void __thiscall QFileInfoPrivate::clear(QFileInfoPrivate *this)

{
  undefined8 *puVar1;
  QAbstractFileEngine *pQVar2;
  QArrayData *pQVar3;
  long lVar4;
  
  (this->metaData).knownFlagsMask.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = 0;
  this->fileFlags = 0;
  *(uint *)&this->field_0x1d8 = *(uint *)&this->field_0x1d8 & 0xc0000000;
  pQVar2 = (this->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (pQVar2 != (QAbstractFileEngine *)0x0) {
    (*pQVar2->_vptr_QAbstractFileEngine[0x16])(pQVar2,0x1000000);
  }
  lVar4 = 0;
  do {
    if (*(long *)((long)this->fileOwners + lVar4 + -0x10) != 0) {
      puVar1 = (undefined8 *)((long)&this->fileOwners[-1].d.d + lVar4);
      pQVar3 = (QArrayData *)*puVar1;
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x108);
  if (this->fileOwners[1].d.ptr != (char16_t *)0x0) {
    pQVar3 = &(this->fileOwners[1].d.d)->super_QArrayData;
    this->fileOwners[1].d.d = (Data *)0x0;
    this->fileOwners[1].d.ptr = (char16_t *)0x0;
    this->fileOwners[1].d.size = 0;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  if (this->fileOwners[0].d.ptr != (char16_t *)0x0) {
    pQVar3 = &(this->fileOwners[0].d.d)->super_QArrayData;
    this->fileOwners[0].d.d = (Data *)0x0;
    this->fileOwners[0].d.ptr = (char16_t *)0x0;
    this->fileOwners[0].d.size = 0;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
        return;
      }
    }
  }
  return;
}

Assistant:

inline void clear() {
        metaData.clear();
        clearFlags();
        for (int i = QAbstractFileEngine::NFileNames - 1 ; i >= 0 ; --i)
            fileNames[i].clear();
        fileOwners[1].clear();
        fileOwners[0].clear();
    }